

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

djg_mesh * djgm_load_torus(float aspect,int ring_segments,int pipe_segments)

{
  djgm_vertex *pdVar1;
  djg_mesh *pdVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pdVar2 = djgm_load_plane(ring_segments,pipe_segments);
  uVar5 = pipe_segments + 2;
  lVar7 = 0;
  uVar3 = 0;
  if (0 < (int)uVar5) {
    uVar3 = (ulong)uVar5;
  }
  iVar4 = -2;
  if (-2 < ring_segments) {
    iVar4 = ring_segments;
  }
  for (uVar8 = 0; uVar6 = uVar3, lVar9 = lVar7, uVar8 != iVar4 + 2; uVar8 = uVar8 + 1) {
    while (uVar6 != 0) {
      pdVar1 = pdVar2->vertexv;
      fVar13 = *(float *)((long)&(pdVar1->st).s + lVar9);
      fVar12 = *(float *)((long)&(pdVar1->st).t + lVar9);
      fVar13 = (fVar13 + fVar13) * 3.1415927;
      fVar12 = (fVar12 + fVar12) * 3.1415927;
      fVar10 = cosf(fVar13);
      fVar10 = fVar10 * aspect + 1.0;
      fVar11 = cosf(fVar12);
      *(float *)((long)&(pdVar1->p).x + lVar9) = fVar11 * fVar10;
      fVar12 = sinf(fVar12);
      *(float *)((long)&(pdVar1->p).y + lVar9) = fVar12 * fVar10;
      fVar13 = sinf(fVar13);
      *(float *)((long)&(pdVar1->p).z + lVar9) = fVar13 * aspect;
      *(undefined8 *)((long)&(pdVar1->dpds).x + lVar9) = 0;
      *(undefined4 *)((long)&(pdVar1->dpds).z + lVar9) = 0;
      *(undefined8 *)((long)&(pdVar1->dpdt).x + lVar9) = 0;
      *(undefined4 *)((long)&(pdVar1->dpdt).z + lVar9) = 0x3f800000;
      uVar6 = uVar6 - 1;
      lVar9 = lVar9 + 0x40;
    }
    lVar7 = lVar7 + (long)(int)uVar5 * 0x40;
  }
  return pdVar2;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_torus(
    float aspect, int ring_segments, int pipe_segments
) {
    djg_mesh *mesh = djgm_load_plane(ring_segments, pipe_segments);
    int i, j;

    ring_segments+= 2;
    pipe_segments+= 2;

    for (i = 0; i < ring_segments; ++i)
    for (j = 0; j < pipe_segments; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * pipe_segments + j];
        float a1 = v->st.s * 2 * M_PI;
        float a2 = v->st.t * 2 * M_PI;
        float tmp = 1 + aspect * cos(a1);
        float tx, ty, tn;

        v->p.x = tmp * cos(a2);
        v->p.y = tmp * sin(a2);
        v->p.z = aspect * sin(a1);

        // tangent (requires normalization)
        v->dpds.x = 0;
        v->dpds.y = 0;
        v->dpds.z = 0;

        // bitangent
        v->dpdt.x = 0;
        v->dpdt.y = 0;
        v->dpdt.z = 1;
    }

    return mesh;
}